

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type,bool enableLangOverrides)

{
  long lVar1;
  long *plVar2;
  undefined7 in_register_00000009;
  long *plVar3;
  size_type *psVar4;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  string local_30;
  
  if ((int)CONCAT71(in_register_00000009,enableLangOverrides) != 0) {
    if (type->base_type - BASE_TYPE_UTYPE < 10 && type->enum_def != (EnumDef *)0x0) {
      NamespacedName_abi_cxx11_(__return_storage_ptr__,this,&type->enum_def->super_Definition);
      return __return_storage_ptr__;
    }
    if (type->base_type == BASE_TYPE_STRUCT) {
      NamespacedName_abi_cxx11_(&local_30,this,&type->struct_def->super_Definition);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x36df12);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_40 = *plVar3;
        lStack_38 = plVar2[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar3;
        local_50 = (long *)*plVar2;
      }
      local_48 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar4) {
        lVar1 = plVar2[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      }
      __return_storage_ptr__->_M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p == &local_30.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,GenTypeBasic::csharp_typename[type->base_type],
             (allocator<char> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const Type &type, bool enableLangOverrides) const {
    // clang-format off
    static const char * const csharp_typename[] = {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE, GTYPE, NTYPE, ...) \
        #NTYPE,
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
    };
    // clang-format on

    if (enableLangOverrides) {
      if (IsEnum(type)) return NamespacedName(*type.enum_def);
      if (type.base_type == BASE_TYPE_STRUCT) {
        return "Offset<" + NamespacedName(*type.struct_def) + ">";
      }
    }

    return csharp_typename[type.base_type];
  }